

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

inform_dist * inform_dist_realloc(inform_dist *dist,size_t n)

{
  uint32_t *puVar1;
  inform_dist *piVar2;
  size_t i;
  uint64_t uVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (n != 0) {
    if (dist == (inform_dist *)0x0) {
      piVar2 = inform_dist_alloc(n);
      return piVar2;
    }
    if (dist->size != n) {
      puVar1 = (uint32_t *)realloc(dist->histogram,n * 4);
      if (puVar1 == (uint32_t *)0x0) {
        dist = (inform_dist *)0x0;
      }
      else {
        dist->histogram = puVar1;
        uVar4 = dist->size;
        if (n < uVar4) {
          dist->size = n;
          uVar3 = 0;
          for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
            uVar3 = uVar3 + puVar1[sVar5];
          }
          dist->counts = uVar3;
        }
        else {
          for (; n != uVar4; uVar4 = uVar4 + 1) {
            puVar1[uVar4] = 0;
          }
          dist->size = n;
        }
      }
    }
  }
  return dist;
}

Assistant:

inform_dist* inform_dist_realloc(inform_dist *dist, size_t n)
{
    // if the requested size is zero, return the original distribution
    if (n == 0)
    {
        return dist;
    }
    // if the distribution is not NULL and the requested size is different
    // from the current size
    if (dist != NULL && dist->size != n)
    {
        // realloc the histogram
        uint32_t *histogram = realloc(dist->histogram, n * sizeof(uint32_t));
        // if the reallocation succeeded
        if (histogram != NULL)
        {
            // reset the distribution's histogram to the new histogram
            dist->histogram = histogram;
            // if the histogram was shrunken
            if (n < dist->size)
            {
                // set the new distribution size
                dist->size = n;
                // sum up the counts that are in the smaller support
                dist->counts = 0;
                for (size_t i = 0; i < dist->size; ++i)
                {
                    dist->counts += dist->histogram[i];
                }
            }
            // otherwise
            else
            {
                // zero out all of the newly observable events
                for (size_t i = dist->size; i < n; ++i)
                {
                    dist->histogram[i] = 0;
                }
                // set the size of the distribution
                dist->size = n;
            }
        }
        // otherwise
        else
        {
            // return NULL leaving the original distribution unscathed
            return NULL;
        }
    }
    // if the original distribution was NULL
    else if (dist == NULL)
    {
        // simply allocate the a new distribution of the requested size
        dist = inform_dist_alloc(n);
    }
    // return the (potentially NULL) distribution
    return dist;
}